

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::EmptyWidth(Compiler *this,EmptyOp empty)

{
  uint32_t begin;
  PatchList end;
  int in_stack_00000014;
  Compiler *in_stack_00000018;
  int id;
  uint32_t in_stack_ffffffffffffffc8;
  EmptyOp in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Frag local_8;
  
  begin = AllocInst(in_stack_00000018,in_stack_00000014);
  if ((int)begin < 0) {
    local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    PODArray<re2::Prog::Inst>::operator[]
              ((PODArray<re2::Prog::Inst> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    Prog::Inst::InitEmptyWidth
              ((Inst *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    end = PatchList::Mk(begin << 1);
    Frag::Frag(&local_8,begin,end);
  }
  return local_8;
}

Assistant:

Frag Compiler::EmptyWidth(EmptyOp empty) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitEmptyWidth(empty, 0);
  return Frag(id, PatchList::Mk(id << 1));
}